

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> __thiscall
enact::Parser::parseEnumStmt(Parser *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TokenType TVar3;
  pointer pcVar4;
  undefined8 uVar5;
  _Head_base<0UL,_enact::Stmt_*,_false> _Var6;
  _func_int **pp_Var7;
  Parser *in_RSI;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> variantType;
  Token name;
  Token variantName;
  vector<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_> variants;
  undefined1 local_f0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  line_t local_c8;
  col_t local_c4;
  _Head_base<0UL,_const_enact::Typename_*,_false> local_c0;
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  undefined1 local_a0 [16];
  _func_int *p_Stack_90;
  line_t local_88;
  col_t local_84;
  TokenType local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  _Alloc_hider local_70;
  undefined1 local_68 [24];
  _Head_base<0UL,_enact::Stmt_*,_false> local_50;
  vector<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_> local_48;
  
  pcVar1 = local_f0 + 0x10;
  local_f0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"Expected enum name.","");
  expect(in_RSI,IDENTIFIER,(string *)local_f0);
  if ((pointer)local_f0._0_8_ != pcVar1) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  local_b8._8_4_ = (in_RSI->m_previous).type;
  local_a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_a0 + 8);
  pcVar4 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar4,pcVar4 + (in_RSI->m_previous).lexeme._M_string_length);
  local_84 = (in_RSI->m_previous).col;
  local_88 = (in_RSI->m_previous).line;
  local_f0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"Expected \'{\' before enum body.","");
  expect(in_RSI,LEFT_BRACE,(string *)local_f0);
  local_50._M_head_impl = (Stmt *)this;
  if ((pointer)local_f0._0_8_ != pcVar1) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  local_48.super__Vector_base<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while ((TVar3 = (in_RSI->m_current).type, TVar3 != RIGHT_BRACE && (TVar3 != END_OF_FILE))) {
    local_f0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f0,"Expected variant declaration in struct body.","");
    expect(in_RSI,IDENTIFIER,(string *)local_f0);
    if ((pointer)local_f0._0_8_ != pcVar1) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
    }
    local_80 = (in_RSI->m_previous).type;
    pcVar4 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
    local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar4,pcVar4 + (in_RSI->m_previous).lexeme._M_string_length);
    local_68._20_2_ = (in_RSI->m_previous).col;
    local_68._16_4_ = (in_RSI->m_previous).line;
    local_f0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f0,"Expected typename after variant name.","");
    expectTypenamePrecFunction((Parser *)local_b8,(string *)in_RSI,SUB81((Variant *)local_f0,0));
    if ((pointer)local_f0._0_8_ != pcVar1) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
    }
    local_f0._0_4_ = local_80;
    local_f0._8_8_ = &local_d8;
    if (local_78 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68) {
      local_d8._8_8_ = local_68._8_8_;
    }
    else {
      local_f0._8_8_ = local_78;
    }
    local_d8._M_allocated_capacity._1_7_ = local_68._1_7_;
    local_d8._M_local_buf[0] = local_68[0];
    local_f0._16_8_ = local_70._M_p;
    local_70._M_p = (pointer)0x0;
    local_68[0] = '\0';
    local_c4 = local_68._20_2_;
    local_c8 = local_68._16_4_;
    local_c0._M_head_impl = (Typename *)local_b8._0_8_;
    local_b8._0_8_ = (CompileContext *)0x0;
    local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_68;
    std::vector<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_>::
    emplace_back<enact::EnumStmt::Variant>(&local_48,(Variant *)local_f0);
    if ((_Head_base<0UL,_const_enact::Typename_*,_false>)local_c0._M_head_impl !=
        (_Head_base<0UL,_const_enact::Typename_*,_false>)0x0) {
      (*(local_c0._M_head_impl)->_vptr_Typename[1])();
    }
    local_c0._M_head_impl = (Typename *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._8_8_ != &local_d8) {
      operator_delete((void *)local_f0._8_8_,local_d8._0_8_ + 1);
    }
    local_f0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f0,"Expected \';\' after enum variant declaration.","");
    expect(in_RSI,SEMICOLON,(string *)local_f0);
    if ((pointer)local_f0._0_8_ != pcVar1) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
    }
    if ((CompileContext *)local_b8._0_8_ != (CompileContext *)0x0) {
      (**(_func_int **)((long)(((string *)local_b8._0_8_)->_M_dataplus)._M_p + 8))();
    }
    if (local_78 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68) {
      operator_delete(local_78,CONCAT71(local_68._1_7_,local_68[0]) + 1);
    }
  }
  local_f0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"Expected \'}\' after enum body.","");
  expect(in_RSI,RIGHT_BRACE,(string *)local_f0);
  if ((pointer)local_f0._0_8_ != pcVar1) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_a0 + 8);
  pp_Var7 = (_func_int **)operator_new(0x50);
  _Var6._M_head_impl = local_50._M_head_impl;
  uVar5 = local_a0._0_8_;
  local_f0._0_4_ = local_b8._8_4_;
  if (local_a8 == paVar2) {
    local_d8._8_8_ = p_Stack_90;
    local_f0._8_8_ = &local_d8;
  }
  else {
    local_f0._8_8_ = local_a8;
  }
  local_d8._M_allocated_capacity._1_7_ = local_a0._9_7_;
  local_d8._M_local_buf[0] = local_a0[8];
  local_a0._0_8_ = 0;
  local_a0[8] = '\0';
  local_c8 = local_88;
  local_c4 = local_84;
  *pp_Var7 = (_func_int *)&PTR__EnumStmt_001290c8;
  *(undefined4 *)(pp_Var7 + 1) = local_b8._8_4_;
  pp_Var7[2] = (_func_int *)(pp_Var7 + 4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._8_8_ == &local_d8) {
    pp_Var7[4] = (_func_int *)local_d8._0_8_;
    pp_Var7[5] = (_func_int *)local_d8._8_8_;
  }
  else {
    pp_Var7[2] = (_func_int *)local_f0._8_8_;
    pp_Var7[4] = (_func_int *)local_d8._0_8_;
  }
  pp_Var7[3] = (_func_int *)uVar5;
  local_f0._16_8_ = 0;
  local_d8._0_8_ = (ulong)(uint7)local_a0._9_7_ << 8;
  *(col_t *)((long)pp_Var7 + 0x34) = local_84;
  *(line_t *)(pp_Var7 + 6) = local_88;
  pp_Var7[7] = (_func_int *)
               local_48.
               super__Vector_base<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_>
               ._M_impl.super__Vector_impl_data._M_start;
  pp_Var7[8] = (_func_int *)
               local_48.
               super__Vector_base<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  pp_Var7[9] = (_func_int *)
               local_48.
               super__Vector_base<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.super__Vector_base<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_50._M_head_impl)->_vptr_Stmt = pp_Var7;
  local_f0._8_8_ = &local_d8;
  local_a8 = paVar2;
  std::vector<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_>::~vector
            (&local_48);
  if (local_a8 != paVar2) {
    operator_delete(local_a8,CONCAT71(local_a0._9_7_,local_a0[8]) + 1);
  }
  return (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
         (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
         _Var6._M_head_impl;
}

Assistant:

std::unique_ptr<Stmt> Parser::parseEnumStmt() {
        expect(TokenType::IDENTIFIER, "Expected enum name.");
        Token name = m_previous;

        expect(TokenType::LEFT_BRACE, "Expected '{' before enum body.");

        std::vector<EnumStmt::Variant> variants;

        while (!check(TokenType::RIGHT_BRACE) && !isAtEnd()) {
            expect(TokenType::IDENTIFIER, "Expected variant declaration in struct body.");
            // Field declaration
            Token variantName = m_previous;
            std::unique_ptr<const Typename> variantType = expectTypename("Expected typename after variant name.", true);

            variants.push_back(EnumStmt::Variant{std::move(variantName), std::move(variantType)});

            expect(TokenType::SEMICOLON, "Expected ';' after enum variant declaration.");
        }

        expect(TokenType::RIGHT_BRACE, "Expected '}' after enum body.");

        return std::make_unique<EnumStmt>(std::move(name), std::move(variants));
    }